

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::DepthStencilModeCase::test
          (DepthStencilModeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  TesterType TVar5;
  GLfloat depthComponentFloat;
  ScopedLogSection section;
  ScopedLogSection section_1;
  GLint depthComponentInt;
  Texture texture;
  allocator<char> local_105;
  GLfloat local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  ScopedLogSection local_60;
  GLuint local_54;
  code *local_50;
  GLenum local_48;
  ObjectWrapper local_40;
  
  TVar5 = (this->super_TextureTest).m_tester;
  bVar2 = isPureIntTester(TVar5);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = isPureUintTester(TVar5);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&local_40,
             (this->super_TextureTest).m_renderCtx);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_40.m_object);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Got Error ",(allocator<char> *)&local_60);
    local_50 = glu::getErrorName;
    local_48 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
    std::operator+(&local_c0,&local_a0,&local_80);
    std::operator+(&local_100,&local_c0,": ");
    std::operator+(&local_e0,&local_100,"bind");
    tcu::ResultCollector::fail(result,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (bVar3 == false) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Initial",(allocator<char> *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Initial",(allocator<char> *)&local_80);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_c0,pTVar1,&local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1902
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_c0);
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Toggle",(allocator<char> *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Toggle",(allocator<char> *)&local_a0);
    tcu::ScopedLogSection::ScopedLogSection(&local_60,pTVar1,&local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    local_54 = 0x1902;
    local_104 = 6402.0;
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1901);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",&local_105);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"set state");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1901
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameteriv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_54);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",&local_105);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"set state");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1902
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,6401.0);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",&local_105);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"set state");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1901
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterfv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_104);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",&local_105);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"set state");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1902
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_60);
  }
  TVar5 = (this->super_TextureTest).m_tester;
  bVar2 = isPureIntTester(TVar5);
  if (bVar2) {
    local_60.m_log._0_4_ = 0x1902;
    local_54 = 0x1901;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_54);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",(allocator<char> *)&local_104);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"glTexParameterIiv");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1901
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_60);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",(allocator<char> *)&local_104);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"glTexParameterIiv");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1902
               ,(this->super_TextureTest).m_type);
    TVar5 = (this->super_TextureTest).m_tester;
  }
  bVar2 = isPureUintTester(TVar5);
  if (bVar2) {
    local_60.m_log._0_4_ = 0x1902;
    local_54 = 0x1901;
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_54);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",(allocator<char> *)&local_104);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"glTexParameterIuiv");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1901
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLuint *)&local_60);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Got Error ",(allocator<char> *)&local_104);
      local_50 = glu::getErrorName;
      local_48 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_50);
      std::operator+(&local_c0,&local_a0,&local_80);
      std::operator+(&local_100,&local_c0,": ");
      std::operator+(&local_e0,&local_100,"glTexParameterIuiv");
      tcu::ResultCollector::fail(result,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x1902
               ,(this->super_TextureTest).m_type);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_40);
  return;
}

Assistant:

void DepthStencilModeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool		isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	glu::Texture	texture		(m_renderCtx);

	gl.glBindTexture(m_target, *texture);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind");

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DEPTH_COMPONENT, m_type);
	}

	if (!isPureCase)
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			depthComponentInt	= GL_DEPTH_COMPONENT;
		const glw::GLfloat			depthComponentFloat	= (glw::GLfloat)GL_DEPTH_COMPONENT;

		gl.glTexParameteri(m_target, m_pname, GL_STENCIL_INDEX);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_STENCIL_INDEX, m_type);

		gl.glTexParameteriv(m_target, m_pname, &depthComponentInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DEPTH_COMPONENT, m_type);

		gl.glTexParameterf(m_target, m_pname, GL_STENCIL_INDEX);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_STENCIL_INDEX, m_type);

		gl.glTexParameterfv(m_target, m_pname, &depthComponentFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DEPTH_COMPONENT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint depthComponent	= GL_DEPTH_COMPONENT;
		const glw::GLint stencilIndex	= GL_STENCIL_INDEX;

		gl.glTexParameterIiv(m_target, m_pname, &stencilIndex);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_STENCIL_INDEX, m_type);

		gl.glTexParameterIiv(m_target, m_pname, &depthComponent);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DEPTH_COMPONENT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint depthComponent	= GL_DEPTH_COMPONENT;
		const glw::GLuint stencilIndex	= GL_STENCIL_INDEX;

		gl.glTexParameterIuiv(m_target, m_pname, &stencilIndex);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_STENCIL_INDEX, m_type);

		gl.glTexParameterIuiv(m_target, m_pname, &depthComponent);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DEPTH_COMPONENT, m_type);
	}
}